

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro_catalog_entry.cpp
# Opt level: O2

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::MacroCatalogEntry::GetInfo(MacroCatalogEntry *this)

{
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *puVar1;
  pointer pCVar2;
  pointer pMVar3;
  pointer *__ptr;
  long in_RSI;
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *this_00;
  unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>_> local_48;
  _Head_base<0UL,_duckdb::MacroFunction_*,_false> local_40;
  __uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_> local_38;
  
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
       (tuple<duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)
       (tuple<duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)this;
  make_uniq<duckdb::CreateMacroInfo,duckdb::CatalogType_const&>
            ((duckdb *)&local_48,(CatalogType *)(in_RSI + 0x10));
  Catalog::GetName_abi_cxx11_(*(Catalog **)(in_RSI + 0xd8));
  pCVar2 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                       *)&local_48);
  ::std::__cxx11::string::_M_assign
            ((string *)&(pCVar2->super_CreateFunctionInfo).super_CreateInfo.catalog);
  pCVar2 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                       *)&local_48);
  ::std::__cxx11::string::_M_assign
            ((string *)&(pCVar2->super_CreateFunctionInfo).super_CreateInfo.schema);
  pCVar2 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                       *)&local_48);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar2->super_CreateFunctionInfo).name);
  puVar1 = *(unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> **)
            (in_RSI + 0x160);
  for (this_00 = *(unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                   **)(in_RSI + 0x158); this_00 != puVar1; this_00 = this_00 + 1) {
    pCVar2 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                           *)&local_48);
    pMVar3 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
             operator->(this_00);
    (*pMVar3->_vptr_MacroFunction[2])(&local_40,pMVar3);
    ::std::
    vector<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>,std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>>
              ((vector<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>,std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>>>
                *)&pCVar2->macros,
               (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                *)&local_40);
    if (local_40._M_head_impl != (MacroFunction *)0x0) {
      (*(local_40._M_head_impl)->_vptr_MacroFunction[1])();
    }
  }
  pCVar2 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                       *)&local_48);
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::operator=((_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)&(pCVar2->super_CreateFunctionInfo).super_CreateInfo.dependencies,
              (_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)(in_RSI + 0xe8));
  pCVar2 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                       *)&local_48);
  Value::operator=(&(pCVar2->super_CreateFunctionInfo).super_CreateInfo.comment,
                   (Value *)(in_RSI + 0x50));
  pCVar2 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                       *)&local_48);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&(pCVar2->super_CreateFunctionInfo).super_CreateInfo.tags,
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)(in_RSI + 0x90));
  *(__uniq_ptr_data<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true,_true>
    *)local_38._M_t.
      super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
      super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
       local_48._M_t.
       super___uniq_ptr_impl<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CreateMacroInfo_*,_std::default_delete<duckdb::CreateMacroInfo>_>
       .super__Head_base<0UL,_duckdb::CreateMacroInfo_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (_Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)
         local_38._M_t.
         super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
         super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<CreateInfo> MacroCatalogEntry::GetInfo() const {
	auto info = make_uniq<CreateMacroInfo>(type);
	info->catalog = catalog.GetName();
	info->schema = schema.name;
	info->name = name;
	for (auto &function : macros) {
		info->macros.push_back(function->Copy());
	}
	info->dependencies = dependencies;
	info->comment = comment;
	info->tags = tags;
	return std::move(info);
}